

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void __thiscall DCanvas::DrawTextureParms(DCanvas *this,FTexture *img,DrawParms *parms)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  byte bVar6;
  ushort uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  ESPSResult EVar11;
  FDynamicColormap *pFVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  fixed_t col;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (parms->colorOverlay < 0x1000000) {
    if (parms->remap == (FRemapTable *)0x0) {
      swrenderer::drawerargs::dc_colormap = (BYTE *)0x0;
    }
    else {
      swrenderer::drawerargs::dc_colormap = parms->remap->Remap;
    }
  }
  else {
    bVar6 = (parms->style).field_0.Flags;
    uVar13 = bVar6 & 0x20;
    uVar16 = uVar13 >> 5 ^ 1;
    if ((bVar6 & 0x10) == 0) {
      uVar16 = uVar13;
    }
    if (uVar16 != 0) {
      parms->colorOverlay = parms->colorOverlay ^ 0xffffff;
    }
    pFVar12 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)(parms->colorOverlay & 0xffffff),0);
    swrenderer::drawerargs::dc_colormap =
         pFVar12->Maps +
         (uint)((int)((ulong)*(byte *)((long)&parms->colorOverlay + 3) * 0x20202040 >> 0x20) << 8);
  }
  if (swrenderer::drawerargs::dc_colormap == (BYTE *)0x0) {
    swrenderer::drawerargs::dc_colormap = &swrenderer::identitymap;
  }
  swrenderer::fixedcolormap = swrenderer::drawerargs::dc_colormap;
  EVar11 = swrenderer::R_SetPatchStyle(parms->style,parms->Alpha,0,parms->fillcolor);
  uVar8 = swrenderer::drawerargs::dc_destorg;
  swrenderer::drawerargs::dc_destorg = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
  if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
    I_FatalError("Attempt to write to buffer of hardware canvas");
  }
  uVar9 = swrenderer::CenterY;
  if (EVar11 != DontDraw) {
    dVar21 = parms->x;
    dVar1 = parms->left;
    dVar2 = parms->destwidth;
    dVar19 = parms->texwidth;
    swrenderer::CenterY = 0;
    modf(parms->y - (parms->top * parms->destheight) / parms->texheight,&swrenderer::sprtopscreen);
    dVar3 = parms->destheight;
    swrenderer::spryscale = dVar3 / (double)img->Height;
    if (swrenderer::spryscale <= 0.0) {
      __assert_fail("spryscale > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0xcb,"virtual void DCanvas::DrawTextureParms(FTexture *, DrawParms &)");
    }
    swrenderer::sprflipvert = 0;
    swrenderer::drawerargs::dc_iscale = SUB84(1.0 / swrenderer::spryscale + 103079215104.0,0);
    swrenderer::dc_texturemid =
         (double)swrenderer::drawerargs::dc_iscale * (-1.0 - swrenderer::sprtopscreen) *
         1.52587890625e-05;
    uVar7 = img->Width;
    dVar4 = parms->destwidth;
    iVar15 = parms->dclip;
    if ((iVar15 != DrawTextureParms::bottomclipper[0]) &&
       (uVar14 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width, uVar14 != 0)) {
      lVar17 = 0;
      do {
        *(short *)((long)DrawTextureParms::bottomclipper + lVar17) = (short)iVar15;
        lVar17 = lVar17 + 2;
      } while (uVar14 * 2 != lVar17);
    }
    iVar18 = parms->uclip;
    if (iVar18 == 0) {
      swrenderer::mceilingclip = (short *)swrenderer::zeroarray;
    }
    else {
      swrenderer::mceilingclip = DrawTextureParms::topclipper;
      if ((iVar18 != DrawTextureParms::topclipper[0]) &&
         (uVar14 = (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width, uVar14 != 0)) {
        lVar17 = 0;
        swrenderer::mceilingclip = DrawTextureParms::topclipper;
        do {
          *(short *)((long)DrawTextureParms::topclipper + lVar17) = (short)iVar18;
          lVar17 = lVar17 + 2;
        } while (uVar14 * 2 != lVar17);
      }
    }
    dVar21 = dVar21 - (dVar1 * dVar2) / dVar19;
    dVar1 = (double)uVar7 / dVar4;
    swrenderer::mfloorclip = DrawTextureParms::bottomclipper;
    if (parms->flipX == 0) {
      col = 0;
    }
    else {
      col = *(int *)&img->Width * 0x10000 + -1;
      dVar1 = -dVar1;
    }
    dVar19 = dVar21 + dVar4;
    dVar2 = parms->windowleft;
    if ((0.0 < dVar2) ||
       (parms->windowright <= parms->texwidth && parms->texwidth != parms->windowright)) {
      dVar5 = parms->texwidth;
      dVar20 = parms->windowright;
      if (dVar5 <= parms->windowright) {
        dVar20 = dVar5;
      }
      dVar21 = dVar21 + dVar2 * (dVar4 / dVar5);
      col = col + SUB84(dVar2 + 103079215104.0,0);
      dVar19 = dVar19 - (dVar5 - dVar20) * (dVar4 / dVar5);
    }
    dVar2 = (double)parms->lclip;
    if (dVar21 < dVar2) {
      col = col + SUB84((dVar2 - dVar21) * dVar1 + 103079215104.0,0);
      dVar21 = dVar2;
    }
    dVar2 = (double)parms->rclip;
    if (dVar19 <= (double)parms->rclip) {
      dVar2 = dVar19;
    }
    uVar13 = (uint)dVar2;
    swrenderer::drawerargs::dc_x = (uint)dVar21;
    uVar16 = uVar13 & 0xfffffffc;
    if (iVar15 - iVar18 < 0x20) {
      uVar16 = swrenderer::drawerargs::dc_x;
    }
    if (dVar3 < 32.0) {
      uVar16 = swrenderer::drawerargs::dc_x;
    }
    if (EVar11 == DoDraw0) {
      uVar16 = swrenderer::drawerargs::dc_x;
    }
    if ((int)swrenderer::drawerargs::dc_x < (int)uVar13) {
      iVar15 = SUB84(dVar1 + 103079215104.0,0);
      if ((swrenderer::drawerargs::dc_x & 3) != 0 && (int)swrenderer::drawerargs::dc_x < (int)uVar16
         ) {
        do {
          swrenderer::R_DrawMaskedColumn(img,col,false,parms->masked == 0);
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1;
          col = col + iVar15;
          if ((int)uVar16 <= (int)swrenderer::drawerargs::dc_x) break;
        } while ((swrenderer::drawerargs::dc_x & 3) != 0);
      }
      while ((int)swrenderer::drawerargs::dc_x < (int)uVar16) {
        swrenderer::rt_initcols((uint8_t *)0x48db91);
        iVar18 = -4;
        uVar10 = swrenderer::drawerargs::dc_x;
        do {
          swrenderer::drawerargs::dc_x = uVar10;
          swrenderer::R_DrawMaskedColumn(img,col,true,parms->masked == 0);
          col = col + iVar15;
          iVar18 = iVar18 + 1;
          uVar10 = swrenderer::drawerargs::dc_x + 1;
        } while (iVar18 != 0);
        iVar18 = swrenderer::drawerargs::dc_x - 3;
        swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1;
        swrenderer::rt_draw4cols(iVar18);
      }
      for (; (int)swrenderer::drawerargs::dc_x < (int)uVar13;
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn(img,col,false,parms->masked == 0);
        col = col + iVar15;
      }
    }
  }
  swrenderer::CenterY = uVar9;
  swrenderer::R_FinishSetPatchStyle();
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar8;
  if ((ticdup != 0) && (menuactive == MENU_Off)) {
    NetUpdate();
    return;
  }
  return;
}

Assistant:

void DCanvas::DrawTextureParms(FTexture *img, DrawParms &parms)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	static short bottomclipper[MAXWIDTH], topclipper[MAXWIDTH];
	const BYTE *translation = NULL;

	if (APART(parms.colorOverlay) != 0)
	{
		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertoverlay = (parms.style.Flags & STYLEF_InvertOverlay);

		if (parms.style.Flags & STYLEF_InvertSource)
		{
			invertoverlay = !invertoverlay;
		}
		if (invertoverlay)
		{
			parms.colorOverlay = PalEntry(parms.colorOverlay).InverseColor();
		}
		// Note that this overrides DTA_Translation in software, but not in hardware.
		FDynamicColormap *colormap = GetSpecialLights(MAKERGB(255,255,255),
			parms.colorOverlay & MAKEARGB(0,255,255,255), 0);
		translation = &colormap->Maps[(APART(parms.colorOverlay)*NUMCOLORMAPS/255)*256];
	}
	else if (parms.remap != NULL)
	{
		translation = parms.remap->Remap;
	}

	if (translation != NULL)
	{
		dc_colormap = (lighttable_t *)translation;
	}
	else
	{
		dc_colormap = identitymap;
	}

	fixedcolormap = dc_colormap;
	ESPSResult mode = R_SetPatchStyle (parms.style, parms.Alpha, 0, parms.fillcolor);

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	double x0 = parms.x - parms.left * parms.destwidth / parms.texwidth;
	double y0 = parms.y - parms.top * parms.destheight / parms.texheight;

	if (mode != DontDraw)
	{
		int stop4;

		double centeryback = CenterY;
		CenterY = 0;

		// There is not enough precision in the drawing routines to keep the full
		// precision for y0. :(
		modf(y0, &sprtopscreen);

		double yscale = parms.destheight / img->GetHeight();
		double iyscale = 1 / yscale;

		spryscale = yscale;
		assert(spryscale > 0);

		sprflipvert = false;
		//dc_iscale = FLOAT2FIXED(iyscale);
		//dc_texturemid = (-y0) * iyscale;
		//dc_iscale = 0xffffffffu / (unsigned)spryscale;
		dc_iscale = FLOAT2FIXED(1 / spryscale);
		dc_texturemid = (CenterY - 1 - sprtopscreen) * dc_iscale / 65536;
		fixed_t frac = 0;
		double xiscale = img->GetWidth() / parms.destwidth;
		double x2 = x0 + parms.destwidth;

		if (bottomclipper[0] != parms.dclip)
		{
			fillshort(bottomclipper, screen->GetWidth(), (short)parms.dclip);
		}
		if (parms.uclip != 0)
		{
			if (topclipper[0] != parms.uclip)
			{
				fillshort(topclipper, screen->GetWidth(), (short)parms.uclip);
			}
			mceilingclip = topclipper;
		}
		else
		{
			mceilingclip = zeroarray;
		}
		mfloorclip = bottomclipper;

		if (parms.flipX)
		{
			frac = (img->GetWidth() << FRACBITS) - 1;
			xiscale = -xiscale;
		}

		if (parms.windowleft > 0 || parms.windowright < parms.texwidth)
		{
			double wi = MIN(parms.windowright, parms.texwidth);
			double xscale = parms.destwidth / parms.texwidth;
			x0 += parms.windowleft * xscale;
			frac += FLOAT2FIXED(parms.windowleft);
			x2 -= (parms.texwidth - wi) * xscale;
		}
		if (x0 < parms.lclip)
		{
			frac += FLOAT2FIXED((parms.lclip - x0) * xiscale);
			x0 = parms.lclip;
		}
		if (x2 > parms.rclip)
		{
			x2 = parms.rclip;
		}

		// Drawing short output ought to fit in the data cache well enough
		// if we draw one column at a time, so do that, since it's simpler.
		if (parms.destheight < 32 || (parms.dclip - parms.uclip) < 32)
		{
			mode = DoDraw0;
		}

		dc_x = int(x0);
		int x2_i = int(x2);
		fixed_t xiscale_i = FLOAT2FIXED(xiscale);

		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = dc_x;
		}
		else	 // DoDraw1`
		{
			// Up to four columns at a time
			stop4 = x2_i & ~3;
		}

		if (dc_x < x2_i)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					R_DrawMaskedColumn(img, frac, true, !parms.masked);
					dc_x++;
					frac += xiscale_i;
				}
				rt_draw4cols(dc_x - 4);
			}

			while (dc_x < x2_i)
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}
		}
		CenterY = centeryback;
	}
	R_FinishSetPatchStyle ();

	dc_destorg = destorgsave;

	if (ticdup != 0 && menuactive == MENU_Off)
	{
		NetUpdate();
	}
#endif
}